

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

void __thiscall icu_63::UnicodeSet::_add(UnicodeSet *this,UnicodeString *s)

{
  UnicodeString *this_00;
  UErrorCode ec;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)s);
    if (this_00 == (UnicodeString *)0x0) {
      setToBogus(this);
      return;
    }
    icu_63::UnicodeString::UnicodeString(this_00,s);
    ec = U_ZERO_ERROR;
    UVector::sortedInsert(this->strings,this_00,compareUnicodeString,&ec);
    if (U_ZERO_ERROR < ec) {
      setToBogus(this);
      (*(this_00->super_Replaceable).super_UObject._vptr_UObject[1])(this_00);
    }
  }
  return;
}

Assistant:

void UnicodeSet::ensureCapacity(int32_t newLen, UErrorCode& ec) {
    if (newLen <= capacity) {
        return;
    }
    UChar32* temp = (UChar32*) uprv_realloc(list, sizeof(UChar32) * (newLen + GROW_EXTRA));
    if (temp == NULL) {
        ec = U_MEMORY_ALLOCATION_ERROR;
        setToBogus(); // set the object to bogus state if an OOM failure occurred.
        return;
    }
    list = temp;
    capacity = newLen + GROW_EXTRA;
    // else we keep the original contents on the memory failure.
}